

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.upb.h
# Opt level: O2

bool upb_test_TestMapField_map_field_set
               (upb_test_TestMapField *msg,int32_t key,int32_t val,upb_Arena *a)

{
  upb_MapInsertStatus uVar1;
  upb_Map *map;
  int32_t val_local;
  int32_t key_local;
  upb_MiniTableField field;
  
  field.number_dont_copy_me__upb_internal_use_only = 1;
  field.offset_dont_copy_me__upb_internal_use_only = 8;
  field.presence = 0;
  field.submsg_index_dont_copy_me__upb_internal_use_only = 0;
  field.descriptortype_dont_copy_me__upb_internal_use_only = '\v';
  field.mode_dont_copy_me__upb_internal_use_only = 0xc0;
  val_local = val;
  key_local = key;
  map = _upb_Message_GetOrCreateMutableMap
                  (&msg->base_dont_copy_me__upb_internal_use_only,&field,4,4,a);
  uVar1 = _upb_Map_Insert(map,&key_local,4,&val_local,4,a);
  return uVar1 != kUpb_MapInsertStatus_OutOfMemory;
}

Assistant:

UPB_INLINE bool upb_test_TestMapField_map_field_set(upb_test_TestMapField* msg, int32_t key, int32_t val, upb_Arena* a) {
  const upb_MiniTableField field = {1, 8, 0, 0, 11, (int)kUpb_FieldMode_Map | ((int)UPB_SIZE(kUpb_FieldRep_4Byte, kUpb_FieldRep_8Byte) << kUpb_FieldRep_Shift)};
  UPB_PRIVATE(_upb_MiniTable_StrongReference)(&upb_0test__TestMapField__MapFieldEntry_msg_init);
  upb_Map* map = _upb_Message_GetOrCreateMutableMap(UPB_UPCAST(msg),
                                                    &field, sizeof(key), sizeof(val), a);
  return _upb_Map_Insert(map, &key, sizeof(key), &val, sizeof(val), a) !=
         kUpb_MapInsertStatus_OutOfMemory;
}